

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger string_slice(HSQUIRRELVM v)

{
  ulong uVar1;
  SQRESULT SVar2;
  SQString *x;
  char *err;
  long lVar3;
  SQObjectPtr o;
  SQInteger eidx;
  long local_28;
  SQObjectPtr local_20;
  
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  get_slice_params(v,&local_28,&eidx,&o);
  uVar1 = (o.super_SQObject._unVal.pString)->_len;
  local_28 = (local_28 >> 0x3f & uVar1) + local_28;
  lVar3 = (eidx >> 0x3f & uVar1) + eidx;
  if (lVar3 < local_28) {
    err = "wrong indexes";
  }
  else {
    if (lVar3 <= (long)uVar1 && -1 < local_28) {
      x = SQString::Create(v->_sharedstate,
                           (SQChar *)
                           ((long)&(o.super_SQObject._unVal.pTable)->_firstfree + local_28),
                           lVar3 - local_28);
      SQObjectPtr::SQObjectPtr(&local_20,x);
      SQVM::Push(v,&local_20);
      SQObjectPtr::~SQObjectPtr(&local_20);
      SVar2 = 1;
      goto LAB_0012c485;
    }
    err = "slice out of range";
  }
  SVar2 = sq_throwerror(v,err);
LAB_0012c485:
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar2;
}

Assistant:

static SQInteger string_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(SQ_FAILED(get_slice_params(v,sidx,eidx,o)))return -1;
    SQInteger slen = _string(o)->_len;
    if(sidx < 0)sidx = slen + sidx;
    if(eidx < 0)eidx = slen + eidx;
    if(eidx < sidx) return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > slen || sidx < 0) return sq_throwerror(v, _SC("slice out of range"));
    v->Push(SQString::Create(_ss(v),&_stringval(o)[sidx],eidx-sidx));
    return 1;
}